

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[46],GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
          (CompilerGLSL *this,char (*ts) [46],GLSLstd450 *ts_1,char (*ts_2) [3],char **ts_3,
          char (*ts_4) [2],char **ts_5,char (*ts_6) [2],char **ts_7,char (*ts_8) [3],char **ts_9,
          char (*ts_10) [3],char **ts_11,char (*ts_12) [3])

{
  bool bVar1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  uint local_84;
  undefined1 local_80 [4];
  uint32_t i;
  char (*local_60) [2];
  char (*ts_local_4) [2];
  char **ts_local_3;
  char (*ts_local_2) [3];
  GLSLstd450 *ts_local_1;
  char (*ts_local) [46];
  CompilerGLSL *this_local;
  
  local_60 = ts_4;
  ts_local_4 = (char (*) [2])ts_3;
  ts_local_3 = (char **)ts_2;
  ts_local_2 = (char (*) [3])ts_1;
  ts_local_1 = (GLSLstd450 *)ts;
  ts_local = (char (*) [46])this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_84 = 0; local_84 < this->indent; local_84 = local_84 + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<char_const(&)[46],GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
              (this,(char (*) [46])ts_local_1,(GLSLstd450 *)ts_local_2,(char (*) [3])ts_local_3,
               (char **)ts_local_4,local_60,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<char_const(&)[46],GLSLstd450_const&,char_const(&)[3],char_const*&,char_const(&)[2],char_const*&,char_const(&)[2],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3],char_const*&,char_const(&)[3]>
              ((string *)local_80,(spirv_cross *)ts_local_1,(char (*) [46])ts_local_2,
               (GLSLstd450 *)ts_local_3,(char (*) [3])ts_local_4,(char **)local_60,
               (char (*) [2])ts_5,(char **)ts_6,(char (*) [2])ts_7,(char **)ts_8,(char (*) [3])ts_9,
               (char **)ts_10,(char (*) [3])ts_11,(char **)ts_12,(char (*) [3])this_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80);
    ::std::__cxx11::string::~string((string *)local_80);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}